

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pznoderep.h
# Opt level: O2

void __thiscall
pzgeom::TPZNodeRep<1,_pztopology::TPZPoint>::TPZNodeRep
          (TPZNodeRep<1,_pztopology::TPZPoint> *this,TPZVec<long> *nodeindexes)

{
  int iVar1;
  long lVar2;
  
  (this->super_TPZPoint).super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_016c3540
  ;
  iVar1 = 1;
  if (nodeindexes->fNElements < 1) {
    iVar1 = (int)nodeindexes->fNElements;
  }
  lVar2 = (long)iVar1;
  memcpy(this->fNodeIndexes,nodeindexes->fStore,lVar2 * 8);
  for (; lVar2 < 1; lVar2 = lVar2 + 1) {
    this->fNodeIndexes[lVar2] = -1;
  }
  return;
}

Assistant:

TPZNodeRep(TPZVec<int64_t> &nodeindexes) : TPZRegisterClassId(&TPZNodeRep::ClassId)
        {
            int nn = nodeindexes.NElements() < N ? nodeindexes.NElements() : N;
#ifdef PZDEBUG
            if(nn<N)
            {
                DebugStop();
            }
#endif
            memcpy(fNodeIndexes,&nodeindexes[0],nn*sizeof(int64_t));
            int i;
            for(i=nn; i<N; i++) fNodeIndexes[i]=-1;
        }